

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6526.hpp
# Opt level: O0

void __thiscall
MOS::MOS6526::MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1>::MOS6526
          (MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *this,
          CIAAHandler *port_handler)

{
  Time local_20;
  CIAAHandler *local_18;
  CIAAHandler *port_handler_local;
  MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *this_local;
  
  local_18 = port_handler;
  port_handler_local = (CIAAHandler *)this;
  MOS6526Storage::MOS6526Storage(&this->super_MOS6526Storage);
  Serial::Line<true>::ReadDelegate::ReadDelegate(&this->super_ReadDelegate);
  (this->super_ReadDelegate)._vptr_ReadDelegate =
       (_func_int **)&PTR_serial_line_did_produce_bit_00c97f60;
  Serial::Line<true>::Line(&this->serial_input);
  this->port_handler_ = local_18;
  TODStorage<true>::TODStorage(&this->tod_);
  Storage::Time::Time(&local_20);
  Serial::Line<true>::set_read_delegate(&this->serial_input,&this->super_ReadDelegate,local_20);
  return;
}

Assistant:

MOS6526(PortHandlerT &port_handler) noexcept : port_handler_(port_handler) {
			serial_input.set_read_delegate(this);
		}